

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O3

void __thiscall QScrollbarStyleAnimation::~QScrollbarStyleAnimation(QScrollbarStyleAnimation *this)

{
  QAbstractAnimation::~QAbstractAnimation((QAbstractAnimation *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QScrollbarStyleAnimation : public QNumberStyleAnimation
{
    Q_OBJECT

public:
    enum Mode { Activating, Deactivating };

    QScrollbarStyleAnimation(Mode mode, QObject *target);

    Mode mode() const;

    bool wasActive() const;
    void setActive(bool active);

private slots:
    void updateCurrentTime(int time) override;

private:
    Mode _mode;
    bool _active;
}